

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraCodeLiteGenerator::CollectSourceFiles
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *makefile,
          cmGeneratorTarget *gt,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
          *cFiles,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *otherFiles)

{
  cmSourceFile *this_00;
  pointer ppcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  bool bVar4;
  TargetType TVar5;
  cmake *this_01;
  string *psVar6;
  string *s;
  mapped_type *ppcVar7;
  string_view ext;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  string *local_60;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  *local_40;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_40 = cFiles;
  local_38 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)otherFiles;
  TVar5 = cmGeneratorTarget::GetType(gt);
  if (TVar5 < OBJECT_LIBRARY) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)(&DAT_00855380 + *(int *)(&DAT_00855380 + (ulong)TVar5 * 4)));
  }
  TVar5 = cmGeneratorTarget::GetType(gt);
  if (TVar5 < OBJECT_LIBRARY) {
    local_68 = &__return_storage_ptr__->field_2;
    local_60 = __return_storage_ptr__;
    this_01 = cmMakefile::GetCMakeInstance(makefile);
    local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CMAKE_BUILD_TYPE","");
    psVar6 = cmMakefile::GetSafeDefinition(makefile,&local_88);
    cmGeneratorTarget::GetSourceFiles(gt,&local_58,psVar6);
    __return_storage_ptr__ = local_60;
    ppcVar1 = local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppcVar2 = local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      __return_storage_ptr__ = local_60;
      ppcVar1 = local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      ppcVar2 = local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
    }
    for (; ppcVar3 = local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish, local_60 = __return_storage_ptr__,
        ppcVar1 !=
        local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
      this_00 = *ppcVar1;
      local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar2;
      psVar6 = cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
      s = cmSourceFile::GetExtension_abi_cxx11_(this_00);
      cmsys::SystemTools::LowerCase(&local_88,s);
      ext._M_str = local_88._M_dataplus._M_p;
      ext._M_len = local_88._M_string_length;
      bVar4 = cmake::IsAKnownSourceExtension(this_01,ext);
      if (bVar4) {
        ppcVar7 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                  ::operator[](local_40,psVar6);
        *ppcVar7 = this_00;
      }
      else {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_38,psVar6);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      __return_storage_ptr__ = local_60;
      ppcVar2 = local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
      local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar3;
    }
    if (local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar2;
      operator_delete(local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::CollectSourceFiles(
  const cmMakefile* makefile, const cmGeneratorTarget* gt,
  std::map<std::string, cmSourceFile*>& cFiles,
  std::set<std::string>& otherFiles)
{
  std::string projectType;
  switch (gt->GetType()) {
    case cmStateEnums::EXECUTABLE: {
      projectType = "Executable";
    } break;
    case cmStateEnums::STATIC_LIBRARY: {
      projectType = "Static Library";
    } break;
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY: {
      projectType = "Dynamic Library";
    } break;
    default:
      break;
  }

  switch (gt->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY: {
      cmake const* cm = makefile->GetCMakeInstance();
      std::vector<cmSourceFile*> sources;
      gt->GetSourceFiles(sources,
                         makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
      for (cmSourceFile* s : sources) {
        std::string const& fullPath = s->ResolveFullPath();
        std::string const& extLower =
          cmSystemTools::LowerCase(s->GetExtension());
        // check whether it is a source or a include file
        // then put it accordingly into one of the two containers
        if (cm->IsAKnownSourceExtension(extLower)) {
          cFiles[fullPath] = s;
        } else {
          otherFiles.insert(fullPath);
        }
      }
    } break;
    default:
      break;
  }
  return projectType;
}